

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O0

TPZSubCompMesh * SubMesh(TPZAutoPointer<TPZCompMesh> *compmesh,int isub)

{
  TPZCompEl *pTVar1;
  int64_t iVar2;
  TPZCompMesh *this;
  TPZCompEl **ppTVar3;
  int in_ESI;
  TPZAutoPointer<TPZCompMesh> *in_RDI;
  TPZSubCompMesh *sub;
  int64_t count;
  int64_t iel;
  TPZCompEl *cel;
  int64_t nel;
  TPZSubCompMesh *local_58;
  long nelem;
  TPZChunkVector<TPZCompEl_*,_10> *this_00;
  
  TPZAutoPointer<TPZCompMesh>::operator->(in_RDI);
  iVar2 = TPZCompMesh::NElements((TPZCompMesh *)0x201ae8f);
  nelem = 0;
  this_00 = (TPZChunkVector<TPZCompEl_*,_10> *)0x0;
  do {
    if (iVar2 <= (long)this_00) {
      return (TPZSubCompMesh *)0x0;
    }
    this = TPZAutoPointer<TPZCompMesh>::operator->(in_RDI);
    TPZCompMesh::ElementVec(this);
    ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[](this_00,nelem);
    pTVar1 = *ppTVar3;
    if (pTVar1 != (TPZCompEl *)0x0) {
      if (pTVar1 == (TPZCompEl *)0x0) {
        local_58 = (TPZSubCompMesh *)0x0;
      }
      else {
        local_58 = (TPZSubCompMesh *)
                   __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
      }
      if ((local_58 != (TPZSubCompMesh *)0x0) && (in_ESI == nelem)) {
        return local_58;
      }
      if (local_58 != (TPZSubCompMesh *)0x0) {
        nelem = nelem + 1;
      }
    }
    this_00 = (TPZChunkVector<TPZCompEl_*,_10> *)
              ((long)&(this_00->super_TPZSavable)._vptr_TPZSavable + 1);
  } while( true );
}

Assistant:

TPZSubCompMesh *SubMesh(TPZAutoPointer<TPZCompMesh> compmesh, int isub)
{
	int64_t nel = compmesh->NElements();
	TPZCompEl *cel;
	int64_t iel, count = 0;
	for(iel=0; iel<nel; iel++)
	{
		cel = compmesh->ElementVec()[iel];
		if(!cel) continue;
		TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
		if(sub && isub == count) return sub;
		if(sub) count++;
	}
	return NULL;
}